

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

bool __thiscall wasm::Literal::isArithmeticNaN(Literal *this)

{
  uintptr_t uVar1;
  bool bVar2;
  
  uVar1 = (this->type).id;
  if (uVar1 == 5) {
    bVar2 = NAN(*(double *)&this->field_0);
  }
  else {
    if (uVar1 != 4) {
      return false;
    }
    bVar2 = NAN(*(float *)&this->field_0);
  }
  if (bVar2) {
    if (uVar1 == 5) {
      if (!NAN(*(double *)&this->field_0)) {
        __assert_fail("std::isnan(f) && \"expected a NaN\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                      ,0x1f9,"static uint64_t wasm::Literal::NaNPayload(double)");
      }
    }
    else if ((uVar1 == 4) && (!NAN(*(float *)&this->field_0))) {
      __assert_fail("std::isnan(f) && \"expected a NaN\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                    ,0x1f2,"static uint32_t wasm::Literal::NaNPayload(float)");
    }
  }
  return false;
}

Assistant:

bool Literal::isArithmeticNaN() {
  if (!isNaN()) {
    return false;
  }
  return (type == Type::f32 && NaNPayload(getf32()) > (1u << 23) - 1) ||
         (type == Type::f64 && NaNPayload(getf64()) > (1ull << 52) - 1);
}